

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall cmTarget::CanCompileSources(cmTarget *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    bVar2 = false;
  }
  else {
    bVar1 = IsSynthetic(this);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = ((this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType < 5;
    }
  }
  return bVar2;
}

Assistant:

bool cmTarget::CanCompileSources() const
{
  if (this->IsImported()) {
    return false;
  }
  if (this->IsSynthetic()) {
    return true;
  }
  switch (this->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      return true;
    case cmStateEnums::UTILITY:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
  return false;
}